

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

bool icu_63::number::impl::AffixUtils::hasNext(AffixTag *tag,UnicodeString *string)

{
  short sVar1;
  bool bVar2;
  char16_t cVar3;
  int iVar4;
  AffixPatternState AVar5;
  int iVar6;
  
  iVar6 = tag->offset;
  if (iVar6 < 0) {
LAB_00254295:
    bVar2 = false;
  }
  else {
    if (iVar6 == 0) {
      sVar1 = (string->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (string->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      return 0 < iVar6;
    }
    AVar5 = tag->state;
    if (AVar5 == STATE_INSIDE_QUOTE) {
      sVar1 = (string->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (string->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      if (iVar6 != iVar4 + -1) {
        return true;
      }
      cVar3 = UnicodeString::doCharAt(string,iVar6);
      if (cVar3 == L'\'') goto LAB_00254295;
      AVar5 = tag->state;
    }
    bVar2 = true;
    if (AVar5 == STATE_BASE) {
      sVar1 = (string->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (string->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      bVar2 = tag->offset < iVar6;
    }
  }
  return bVar2;
}

Assistant:

bool AffixUtils::hasNext(const AffixTag &tag, const UnicodeString &string) {
    // First check for the {-1} and default initializer syntax.
    if (tag.offset < 0) {
        return false;
    } else if (tag.offset == 0) {
        return string.length() > 0;
    }
    // The rest of the fields are safe to use now.
    // Special case: the last character in string is an end quote.
    if (tag.state == STATE_INSIDE_QUOTE && tag.offset == string.length() - 1 &&
        string.charAt(tag.offset) == u'\'') {
        return false;
    } else if (tag.state != STATE_BASE) {
        return true;
    } else {
        return tag.offset < string.length();
    }
}